

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listtype.c
# Opt level: O0

LuciObject * list_get_object(LuciObject *list,long index)

{
  long *plVar1;
  LuciObject *pLVar2;
  int iVar3;
  LuciObject *item;
  LuciListObj *listobj;
  long index_local;
  LuciObject *list_local;
  
  if ((list == (LuciObject *)0x0) || (listobj = (LuciListObj *)index, list->type != &obj_list_t)) {
    fprintf(_stderr,"FATAL: %s","Can\'t iterate over non-list object\n");
    exit(1);
  }
  while ((long)listobj < 0) {
    iVar3 = (int)listobj;
    if (iVar3 < 1) {
      iVar3 = -iVar3;
    }
    listobj = (LuciListObj *)(ulong)(uint)(*(int *)&list[1].field_0x8 - iVar3);
  }
  if ((long)listobj < (long)(ulong)*(uint *)&list[1].field_0x8) {
    plVar1 = (long *)(&(list[1].type)->type_name)[(long)listobj];
    pLVar2 = (LuciObject *)(**(code **)(*plVar1 + 0x10))(plVar1);
    return pLVar2;
  }
  fprintf(_stderr,"FATAL: %s","List index out of bounds\n");
  exit(1);
}

Assistant:

static LuciObject *list_get_object(LuciObject *list, long index)
{
    if (!list || (!ISTYPE(list, obj_list_t))) {
	LUCI_DIE("%s", "Can't iterate over non-list object\n");
    }

    LuciListObj *listobj = (LuciListObj *)list;

    /* convert negative indices to a index starting from list end */
    while (index < 0) {
	index = listobj->count - abs(index);
    }

    if (index >= listobj->count) {
	LUCI_DIE("%s", "List index out of bounds\n");
    }
    LuciObject *item = listobj->items[index];
    return item->type->copy(item);
}